

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O0

void __thiscall
s_energy_matrix::compute_hotspot_energy
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,bool is_stack)

{
  energy_t eVar1;
  reference pvVar2;
  reference pvVar3;
  undefined1 in_CL;
  int in_EDX;
  int in_ESI;
  s_energy_matrix *in_RDI;
  s_energy_matrix *unaff_retaddr;
  cand_pos_t in_stack_00000010;
  cand_pos_t ij;
  energy_t energy;
  cand_pos_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar4;
  
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if ((char)(uVar4 >> 0x18) == '\0') {
    eVar1 = HairpinE(in_RDI,(string *)CONCAT44(in_ESI,in_EDX),(short *)((ulong)uVar4 << 0x20),
                     (short *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (paramT *)in_RDI,in_stack_ffffffffffffffd4,in_stack_00000010);
  }
  else {
    eVar1 = compute_stack(unaff_retaddr,(cand_pos_t)((ulong)in_RDI >> 0x20),(cand_pos_t)in_RDI,
                          (paramT *)CONCAT44(in_ESI,in_EDX));
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)in_ESI);
  pvVar3 = std::vector<free_energy_node,_std::allocator<free_energy_node>_>::operator[]
                     (&in_RDI->nodes,(long)((*pvVar2 + in_EDX) - in_ESI));
  pvVar3->energy = eVar1;
  return;
}

Assistant:

void s_energy_matrix::compute_hotspot_energy (cand_pos_t i, cand_pos_t j, bool is_stack)
{
    //printf("in compute_hotspot_energy i:%d j:%d\n",i,j);
    energy_t energy = 0;
    if(is_stack){
        energy = compute_stack(i,j,params_);
        // printf("stack: %d\n",energy);
    }else{
        energy = HairpinE(seq_,S_,S1_,params_,i,j);
        // printf("hairpin: %d\n",energy);
    }
        
    cand_pos_t ij = index[i]+j-i;
    nodes[ij].energy = energy;
    return;
}